

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void jpeg_save_markers(j_decompress_ptr cinfo,int marker_code,uint length_limit)

{
  jpeg_marker_reader *pjVar1;
  long lVar2;
  _func_int_j_decompress_ptr *local_30;
  jpeg_marker_parser_method processor;
  long maxlength;
  my_marker_ptr marker;
  uint length_limit_local;
  int marker_code_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->marker;
  lVar2 = cinfo->mem->max_alloc_chunk + -0x20;
  marker._0_4_ = length_limit;
  if (lVar2 < (long)(ulong)length_limit) {
    marker._0_4_ = (uint)lVar2;
  }
  if ((uint)marker == 0) {
    local_30 = skip_variable;
    if ((marker_code == 0xe0) || (marker_code == 0xee)) {
      local_30 = get_interesting_appn;
    }
  }
  else {
    local_30 = save_marker;
    if ((marker_code == 0xe0) && ((uint)marker < 0xe)) {
      marker._0_4_ = 0xe;
    }
    else if ((marker_code == 0xee) && ((uint)marker < 0xc)) {
      marker._0_4_ = 0xc;
    }
  }
  if (marker_code == 0xfe) {
    pjVar1[1].reset_marker_reader = (_func_void_j_decompress_ptr *)local_30;
    *(uint *)&pjVar1[4].read_restart_marker = (uint)marker;
  }
  else if ((marker_code < 0xe0) || (0xef < marker_code)) {
    cinfo->err->msg_code = 0x46;
    (cinfo->err->msg_parm).i[0] = marker_code;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    (&pjVar1[1].read_markers)[marker_code + -0xe0] = local_30;
    *(uint *)((long)&pjVar1[4].read_restart_marker + (long)(marker_code + -0xe0) * 4 + 4) =
         (uint)marker;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_save_markers (j_decompress_ptr cinfo, int marker_code,
		   unsigned int length_limit)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;
  long maxlength;
  jpeg_marker_parser_method processor;

  /* Length limit mustn't be larger than what we can allocate
   * (should only be a concern in a 16-bit environment).
   */
  maxlength = cinfo->mem->max_alloc_chunk - SIZEOF(struct jpeg_marker_struct);
  if (((long) length_limit) > maxlength)
    length_limit = (unsigned int) maxlength;

  /* Choose processor routine to use.
   * APP0/APP14 have special requirements.
   */
  if (length_limit) {
    processor = save_marker;
    /* If saving APP0/APP14, save at least enough for our internal use. */
    if (marker_code == (int) M_APP0 && length_limit < APP0_DATA_LEN)
      length_limit = APP0_DATA_LEN;
    else if (marker_code == (int) M_APP14 && length_limit < APP14_DATA_LEN)
      length_limit = APP14_DATA_LEN;
  } else {
    processor = skip_variable;
    /* If discarding APP0/APP14, use our regular on-the-fly processor. */
    if (marker_code == (int) M_APP0 || marker_code == (int) M_APP14)
      processor = get_interesting_appn;
  }

  if (marker_code == (int) M_COM) {
    marker->process_COM = processor;
    marker->length_limit_COM = length_limit;
  } else if (marker_code >= (int) M_APP0 && marker_code <= (int) M_APP15) {
    marker->process_APPn[marker_code - (int) M_APP0] = processor;
    marker->length_limit_APPn[marker_code - (int) M_APP0] = length_limit;
  } else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}